

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm.c
# Opt level: O2

double residual_norm_C(double *approximation,uint dimension,double *space_coordinate,
                      double time_upper_boundary,_func_double_double_double *approximated)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  
  dVar1 = *approximation;
  dVar2 = (*approximated)(*space_coordinate,time_upper_boundary);
  dVar1 = ABS(dVar1 - dVar2);
  for (uVar5 = 1; uVar5 < dimension; uVar5 = uVar5 + 1) {
    dVar2 = approximation[uVar5];
    dVar3 = (*approximated)(space_coordinate[uVar5],time_upper_boundary);
    dVar4 = ABS(dVar2 - dVar3);
    if (ABS(dVar2 - dVar3) <= dVar1) {
      dVar4 = dVar1;
    }
    dVar1 = dVar4;
  }
  return dVar1;
}

Assistant:

double residual_norm_C (double const * approximation, 
                        unsigned dimension, 
                        double const * space_coordinate, 
                        double time_upper_boundary,
                        double (*approximated) (double, double)) {
  double norm = fabs (approximation[0] - approximated (space_coordinate[0], time_upper_boundary));
  unsigned space_step;
  for (space_step = 1; space_step < dimension; ++space_step) {
    norm = max (fabs (approximation[space_step] - approximated (space_coordinate[space_step], time_upper_boundary)), norm);
  }
  return norm;
}